

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::TestCaseFilters::shouldInclude(TestCaseFilters *this,TestCase *testCase)

{
  pointer pTVar1;
  bool bVar2;
  bool bVar3;
  pointer pTVar4;
  const_iterator it;
  pointer this_00;
  pointer pTVar5;
  
  this_00 = (this->m_tagExpressions).
            super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
            super__Vector_impl_data._M_start;
  pTVar1 = (this->m_tagExpressions).
           super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 == pTVar1) {
LAB_0013f7fa:
    pTVar4 = (this->m_inclusionFilters).
             super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar5 = (this->m_inclusionFilters).
             super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar4 == pTVar5) {
      pTVar5 = (this->m_exclusionFilters).
               super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pTVar4 = (this->m_exclusionFilters).
               super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((pTVar5 == pTVar4) &&
         (pTVar4 = pTVar5,
         (this->m_tagExpressions).
         super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
         super__Vector_impl_data._M_start ==
         (this->m_tagExpressions).
         super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
         super__Vector_impl_data._M_finish)) {
        return (bool)((testCase->super_TestCaseInfo).isHidden ^ 1);
      }
LAB_0013f854:
      do {
        bVar2 = pTVar5 == pTVar4;
        if (bVar2) {
          return bVar2;
        }
        bVar3 = TestCaseFilter::shouldInclude(pTVar5,testCase);
        pTVar5 = pTVar5 + 1;
      } while (bVar3);
      return bVar2;
    }
    for (; pTVar4 != pTVar5; pTVar4 = pTVar4 + 1) {
      bVar2 = TestCaseFilter::shouldInclude(pTVar4,testCase);
      if (bVar2) {
        if (pTVar4 == pTVar5) {
          return false;
        }
        pTVar5 = (this->m_exclusionFilters).
                 super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pTVar4 = (this->m_exclusionFilters).
                 super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        goto LAB_0013f854;
      }
    }
  }
  else {
    for (; this_00 != pTVar1; this_00 = this_00 + 1) {
      bVar2 = TagExpression::matches(this_00,&(testCase->super_TestCaseInfo).tags);
      if (bVar2) {
        if (this_00 == pTVar1) {
          return false;
        }
        goto LAB_0013f7fa;
      }
    }
  }
  return false;
}

Assistant:

bool shouldInclude( TestCase const& testCase ) const {
            if( !m_tagExpressions.empty() ) {
                std::vector<TagExpression>::const_iterator it = m_tagExpressions.begin();
                std::vector<TagExpression>::const_iterator itEnd = m_tagExpressions.end();
                for(; it != itEnd; ++it )
                    if( it->matches( testCase.getTags() ) )
                        break;
                if( it == itEnd )
                    return false;
            }

            if( !m_inclusionFilters.empty() ) {
                std::vector<TestCaseFilter>::const_iterator it = m_inclusionFilters.begin();
                std::vector<TestCaseFilter>::const_iterator itEnd = m_inclusionFilters.end();
                for(; it != itEnd; ++it )
                    if( it->shouldInclude( testCase ) )
                        break;
                if( it == itEnd )
                    return false;
            }
            else if( m_exclusionFilters.empty() && m_tagExpressions.empty() ) {
                return !testCase.isHidden();
            }

            std::vector<TestCaseFilter>::const_iterator it = m_exclusionFilters.begin();
            std::vector<TestCaseFilter>::const_iterator itEnd = m_exclusionFilters.end();
            for(; it != itEnd; ++it )
                if( !it->shouldInclude( testCase ) )
                    return false;
            return true;
        }